

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O0

int __thiscall ncnn::LRN::forward_inplace(LRN *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 *in_RDX;
  long *in_RSI;
  long in_RDI;
  float fVar1;
  float val;
  int k;
  float ss;
  float *sptr_1;
  int j_1;
  int i_5;
  Mat m_5;
  float *ptr_3;
  int q_2;
  int j;
  int i_4;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  float alpha_div_size_1;
  int maxk;
  Option opt_b;
  int pad;
  Mat square_blob_bordered;
  int outh;
  int outw;
  int i_3;
  float *ptr_2;
  int i_2;
  float *sptr;
  int p;
  float *ssptr;
  int q_1;
  float alpha_div_size;
  Mat square_sum;
  int i;
  float *outptr;
  float *ptr;
  int q;
  Mat square_blob;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m_7;
  Mat *m_6;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  int i_1;
  float *ptr_1;
  int size_1;
  allocator_type *in_stack_fffffffffffff320;
  void **ppvVar2;
  size_type in_stack_fffffffffffff328;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff330;
  undefined8 in_stack_fffffffffffff338;
  undefined4 in_stack_fffffffffffff340;
  float in_stack_fffffffffffff344;
  float fVar3;
  undefined8 in_stack_fffffffffffff348;
  undefined8 in_stack_fffffffffffff350;
  Mat *in_stack_fffffffffffff358;
  Mat *in_stack_fffffffffffff360;
  int in_stack_fffffffffffff370;
  Option *in_stack_fffffffffffff378;
  bool local_b89;
  bool local_b19;
  int local_b00;
  float local_afc;
  int local_af0;
  int local_aec;
  void *local_ae8;
  int *local_ae0;
  ulong local_ad8;
  undefined4 local_ad0;
  long *local_ac8;
  int local_ac0;
  int local_abc;
  int local_ab8;
  undefined4 local_ab4;
  undefined4 local_ab0;
  ulong local_aa8;
  undefined8 local_aa0;
  undefined8 local_a98;
  undefined8 local_a90;
  undefined4 local_a88;
  long local_a80;
  undefined4 local_a78;
  undefined4 local_a74;
  undefined4 local_a70;
  undefined4 local_a6c;
  undefined4 local_a68;
  undefined8 local_a60;
  long local_a58;
  int local_a50;
  int local_a4c;
  int local_a48;
  int local_a44;
  int local_a40;
  int local_a3c;
  reference local_a38;
  vector<int,_std::allocator<int>_> local_a28;
  float local_a10;
  int local_a0c;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined4 local_9f8;
  undefined4 uStack_9f4;
  undefined4 uStack_9f0;
  undefined4 uStack_9ec;
  ulong local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  int local_9bc;
  void *local_9b8;
  int *local_9b0;
  ulong local_9a8;
  undefined4 local_9a0;
  long *local_998;
  int local_990;
  int local_98c;
  int local_988;
  undefined4 local_984;
  int local_980;
  long local_978;
  int local_96c;
  int local_968;
  int local_964;
  undefined8 local_960;
  undefined8 local_958;
  undefined8 local_950;
  undefined4 local_948;
  long local_940;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 local_930;
  undefined4 local_92c;
  undefined4 local_928;
  undefined8 local_920;
  long local_918;
  int local_90c;
  undefined8 local_908;
  undefined8 local_900;
  undefined8 local_8f8;
  undefined4 local_8f0;
  long *local_8e8;
  undefined4 local_8e0;
  undefined4 local_8dc;
  undefined4 local_8d8;
  undefined4 local_8d4;
  undefined4 local_8d0;
  undefined8 local_8c8;
  void *local_8c0;
  int local_8b4;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined4 local_898;
  long *local_890;
  undefined4 local_888;
  undefined4 local_884;
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  undefined8 local_870;
  undefined4 *local_868;
  int local_860;
  float local_85c;
  undefined4 *local_858;
  int *local_850;
  long local_848;
  undefined4 local_840;
  long *local_838;
  undefined4 local_830;
  int local_82c;
  int local_828;
  undefined4 local_824;
  int local_820;
  long local_818;
  int local_80c;
  undefined8 local_808;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined4 local_7f0;
  long *local_7e8;
  undefined4 local_7e0;
  undefined4 local_7dc;
  undefined4 local_7d8;
  undefined4 local_7d4;
  undefined4 local_7d0;
  undefined8 local_7c8;
  void *local_7c0;
  undefined8 local_7b8;
  undefined8 local_7b0;
  undefined8 local_7a8;
  undefined4 local_7a0;
  long local_798;
  undefined4 local_790;
  undefined4 local_78c;
  undefined4 local_788;
  undefined4 local_784;
  undefined4 local_780;
  undefined8 local_778;
  long local_770;
  int local_764;
  int local_760;
  void *local_750;
  int *local_748;
  ulong local_740;
  undefined4 local_738;
  long *local_730;
  int local_728;
  int local_724;
  int local_720;
  undefined4 local_71c;
  int local_718;
  long local_710;
  int local_704;
  long local_700;
  int local_6f4;
  int local_6f0;
  int local_6ec;
  undefined8 *local_6e8;
  long *local_6e0;
  int local_6cc;
  void **local_6c8;
  undefined4 **local_6c0;
  void **local_6b8;
  undefined4 **local_6b0;
  void **local_6a8;
  undefined1 local_69d;
  int local_69c;
  void **local_698;
  void **local_690;
  undefined1 local_685;
  int local_684;
  undefined8 *local_678;
  undefined1 local_66d;
  int local_66c;
  undefined8 *local_660;
  undefined1 local_655;
  int local_654;
  void **local_650;
  undefined8 *local_648;
  undefined1 local_63d;
  int local_63c;
  undefined4 **local_638;
  undefined8 *local_630;
  undefined1 local_625;
  int local_624;
  void **local_620;
  undefined8 *local_618;
  undefined1 local_60d;
  int local_60c;
  undefined8 *local_600;
  undefined8 *local_5f8;
  undefined8 *local_5f0;
  undefined8 *local_5b0;
  undefined8 *local_5a0;
  undefined8 *local_590;
  undefined8 *local_580;
  undefined8 *local_570;
  undefined4 **local_560;
  undefined8 *local_550;
  void **local_540;
  void **local_530;
  void **local_520;
  undefined8 *local_510;
  undefined8 *local_508;
  undefined8 *local_500;
  undefined8 *local_4f8;
  int local_4ec;
  undefined4 *local_4e8;
  int local_4e0;
  undefined4 local_4dc;
  undefined4 **local_4d8;
  void **local_4d0;
  void **local_4c8;
  int local_4bc;
  void **local_4b8;
  undefined4 **local_4b0;
  void **local_4a8;
  undefined4 **local_4a0;
  void **local_498;
  long local_490;
  undefined4 local_484;
  long local_480;
  long local_478;
  undefined4 local_46c;
  int local_468;
  int local_464;
  undefined8 *local_460;
  long *local_458;
  undefined4 local_44c;
  ulong local_448;
  void *local_440;
  undefined4 local_434;
  int local_430;
  int local_42c;
  undefined8 *local_428;
  long *local_420;
  undefined4 local_414;
  long local_410;
  undefined4 *local_408;
  undefined4 local_3fc;
  int local_3f8;
  int local_3f4;
  undefined8 *local_3f0;
  long *local_3e8;
  undefined4 local_3dc;
  ulong local_3d8;
  void *local_3d0;
  undefined4 local_3c4;
  int local_3c0;
  int local_3bc;
  undefined8 *local_3b8;
  long local_3b0;
  undefined4 local_3a4;
  long local_3a0;
  long local_398;
  undefined4 local_38c;
  int local_388;
  int local_384;
  undefined8 *local_380;
  long local_378;
  undefined4 local_36c;
  long local_368;
  long local_360;
  undefined4 local_354;
  int local_350;
  int local_34c;
  undefined8 *local_348;
  long *local_340;
  undefined4 local_334;
  ulong local_330;
  void *local_328;
  undefined4 local_31c;
  void **local_310;
  undefined4 local_304;
  long local_300;
  undefined4 local_2f4;
  long local_2f0;
  undefined4 local_2e4;
  long local_2e0;
  undefined4 local_2d4;
  long local_2d0;
  undefined4 local_2c4;
  long local_2c0;
  undefined4 local_2b4;
  long local_2b0;
  undefined4 local_2a4;
  long local_2a0;
  int local_288;
  undefined4 local_284;
  void **local_280;
  int local_268;
  undefined4 local_264;
  void **local_260;
  int local_248;
  undefined4 local_244;
  void **local_240;
  undefined8 *local_220;
  int local_208;
  undefined4 local_204;
  undefined4 **local_200;
  undefined8 *local_1e0;
  undefined8 *local_1c0;
  undefined8 *local_1a0;
  undefined8 *local_180;
  undefined8 *local_160;
  undefined4 *local_60;
  void *local_40;
  void *local_30;
  void *local_20;
  int local_10;
  undefined4 local_c;
  void **local_8;
  
  local_6ec = *(int *)((long)in_RSI + 0x2c);
  local_6f0 = (int)in_RSI[6];
  local_6f4 = (int)in_RSI[7];
  local_700 = in_RSI[2];
  local_704 = local_6ec * local_6f0;
  local_6c8 = &local_750;
  local_750 = (void *)0x0;
  local_748 = (int *)0x0;
  local_740 = 0;
  local_738 = 0;
  local_730 = (long *)0x0;
  local_728 = 0;
  local_724 = 0;
  local_720 = 0;
  local_71c = 0;
  local_718 = 0;
  local_710 = 0;
  local_6e8 = in_RDX;
  local_6e0 = in_RSI;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340),
              (int)((ulong)in_stack_fffffffffffff338 >> 0x20),(int)in_stack_fffffffffffff338,
              (int)((ulong)in_stack_fffffffffffff330 >> 0x20),in_stack_fffffffffffff328,
              (Allocator *)in_stack_fffffffffffff320);
  local_6a8 = &local_750;
  if (local_750 != (void *)0x0) {
    local_4a8 = local_6a8;
  }
  local_b19 = local_750 == (void *)0x0 || local_710 * local_718 == 0;
  if (local_b19) {
    local_6cc = -100;
    local_760 = 1;
    goto LAB_00d04c48;
  }
  for (local_764 = 0; local_764 < local_6f4; local_764 = local_764 + 1) {
    local_600 = &local_7b8;
    local_464 = *(int *)((long)local_6e0 + 0x2c);
    local_468 = (int)local_6e0[6];
    local_46c = *(undefined4 *)((long)local_6e0 + 0x34);
    local_770 = *local_6e0 + local_6e0[8] * (long)local_764 * local_6e0[2];
    local_480 = local_6e0[2];
    local_484 = (undefined4)local_6e0[3];
    local_490 = local_6e0[4];
    local_460 = &local_7b8;
    local_2a0 = (long)local_464 * (long)local_468 * local_480;
    local_5f0 = &local_7b8;
    local_5b0 = &local_7b8;
    local_618 = &local_808;
    local_620 = &local_750;
    local_7c0 = (void *)((long)local_750 + local_710 * local_764 * local_740);
    local_428 = &local_808;
    local_2b0 = (long)local_724 * (long)local_720 * local_740;
    local_780 = 0;
    local_784 = 0;
    local_788 = 0;
    local_78c = 0;
    local_7a0 = 0;
    local_7a8 = 0;
    local_7b0 = 0;
    local_7b8 = 0;
    local_7e8 = local_730;
    local_2a4 = 0x10;
    local_2b4 = 0x10;
    local_42c = local_724;
    local_430 = local_720;
    local_434 = local_71c;
    local_448 = local_740;
    local_44c = local_738;
    local_458 = local_730;
    local_60c = local_764;
    local_60d = 1;
    local_624 = local_764;
    local_625 = 1;
    local_778 = 0;
    local_790 = 0;
    local_4f8 = &local_808;
    local_5a0 = &local_808;
    local_808 = 0;
    local_7f8 = 0;
    local_7f0 = 0;
    local_7e0 = 0;
    local_7dc = 0;
    local_7d8 = 0;
    local_7d4 = 0;
    local_7d0 = 0;
    local_7c8 = 0;
    local_800 = 0;
    for (local_80c = 0; local_80c < local_704; local_80c = local_80c + 1) {
      *(float *)((long)local_7c0 + (long)local_80c * 4) =
           *(float *)(local_770 + (long)local_80c * 4) * *(float *)(local_770 + (long)local_80c * 4)
      ;
    }
    local_478 = local_770;
    local_440 = local_7c0;
    local_180 = local_5a0;
    local_160 = local_5b0;
    local_798 = local_490;
  }
  if (*(int *)(in_RDI + 0xd0) == 0) {
    local_6c0 = &local_858;
    local_858 = (undefined4 *)0x0;
    local_850 = (int *)0x0;
    local_848 = 0;
    local_840 = 0;
    local_838 = (long *)0x0;
    local_830 = 0;
    local_82c = 0;
    local_828 = 0;
    local_824 = 0;
    local_820 = 0;
    local_818 = 0;
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340),
                (int)((ulong)in_stack_fffffffffffff338 >> 0x20),(int)in_stack_fffffffffffff338,
                (int)((ulong)in_stack_fffffffffffff330 >> 0x20),in_stack_fffffffffffff328,
                (Allocator *)in_stack_fffffffffffff320);
    local_6b0 = &local_858;
    if (local_858 != (undefined4 *)0x0) {
      local_4a0 = local_6b0;
    }
    local_b89 = local_858 != (undefined4 *)0x0 && local_818 * local_820 != 0;
    if (local_b89) {
      local_4d8 = &local_858;
      local_4dc = 0;
      local_4e0 = (int)local_818 * local_820;
      local_4e8 = local_858;
      for (local_4ec = 0; local_4ec < local_4e0; local_4ec = local_4ec + 1) {
        *local_4e8 = 0;
        local_4e8 = local_4e8 + 1;
      }
      local_85c = *(float *)(in_RDI + 0xd8) / (float)*(int *)(in_RDI + 0xd4);
      local_4b0 = local_4d8;
      for (local_860 = 0; local_860 < local_6f4; local_860 = local_860 + 1) {
        local_630 = &local_8b0;
        local_638 = &local_858;
        local_868 = (undefined4 *)((long)local_858 + local_818 * local_860 * local_848);
        local_3f0 = &local_8b0;
        local_2c0 = (long)local_82c * (long)local_828 * local_848;
        local_500 = &local_8b0;
        local_590 = &local_8b0;
        local_890 = local_838;
        local_2c4 = 0x10;
        local_3f4 = local_82c;
        local_3f8 = local_828;
        local_3fc = local_824;
        local_410 = local_848;
        local_414 = local_840;
        local_420 = local_838;
        local_63c = local_860;
        local_63d = 1;
        local_8b0 = 0;
        local_8a0 = 0;
        local_898 = 0;
        local_888 = 0;
        local_884 = 0;
        local_880 = 0;
        local_87c = 0;
        local_878 = 0;
        local_870 = 0;
        local_8a8 = 0;
        for (local_8b4 = local_860 - *(int *)(in_RDI + 0xd4) / 2;
            local_8b4 <= local_860 + *(int *)(in_RDI + 0xd4) / 2; local_8b4 = local_8b4 + 1) {
          if ((-1 < local_8b4) && (local_8b4 < local_6f4)) {
            local_648 = &local_908;
            local_650 = &local_750;
            local_8c0 = (void *)((long)local_750 + local_710 * local_8b4 * local_740);
            local_3b8 = &local_908;
            local_2d0 = (long)local_724 * (long)local_720 * local_740;
            local_5f8 = &local_908;
            local_580 = &local_908;
            local_8e8 = local_730;
            local_2d4 = 0x10;
            local_3bc = local_724;
            local_3c0 = local_720;
            local_3c4 = local_71c;
            local_3d8 = local_740;
            local_3dc = local_738;
            local_3e8 = local_730;
            local_654 = local_8b4;
            local_655 = 1;
            local_908 = 0;
            local_8f8 = 0;
            local_8f0 = 0;
            local_8e0 = 0;
            local_8dc = 0;
            local_8d8 = 0;
            local_8d4 = 0;
            local_8d0 = 0;
            local_8c8 = 0;
            local_900 = 0;
            for (local_90c = 0; local_3d0 = local_8c0, local_1c0 = local_580, local_90c < local_704;
                local_90c = local_90c + 1) {
              local_868[local_90c] =
                   *(float *)((long)local_8c0 + (long)local_90c * 4) + (float)local_868[local_90c];
            }
          }
        }
        local_660 = &local_960;
        local_384 = *(int *)((long)local_6e0 + 0x2c);
        local_388 = (int)local_6e0[6];
        local_38c = *(undefined4 *)((long)local_6e0 + 0x34);
        local_918 = *local_6e0 + local_6e0[8] * (long)local_860 * local_6e0[2];
        local_3a0 = local_6e0[2];
        local_3a4 = (undefined4)local_6e0[3];
        local_3b0 = local_6e0[4];
        local_380 = &local_960;
        local_2e0 = (long)local_384 * (long)local_388 * local_3a0;
        local_508 = &local_960;
        local_570 = &local_960;
        local_2e4 = 0x10;
        local_66c = local_860;
        local_66d = 1;
        local_960 = 0;
        local_950 = 0;
        local_948 = 0;
        local_938 = 0;
        local_934 = 0;
        local_930 = 0;
        local_92c = 0;
        local_928 = 0;
        local_920 = 0;
        local_958 = 0;
        local_408 = local_868;
        local_398 = local_918;
        local_1e0 = local_570;
        local_1a0 = local_590;
        local_940 = local_3b0;
        for (local_964 = 0; local_964 < local_704; local_964 = local_964 + 1) {
          fVar3 = *(float *)(local_918 + (long)local_964 * 4);
          fVar1 = powf(*(float *)(in_RDI + 0xe0) + local_85c * (float)local_868[local_964],
                       -*(float *)(in_RDI + 0xdc));
          *(float *)(local_918 + (long)local_964 * 4) = fVar3 * fVar1;
        }
      }
      local_760 = 0;
    }
    else {
      local_6cc = -100;
      local_760 = 1;
    }
    local_560 = &local_858;
    local_200 = local_560;
    if (local_850 != (int *)0x0) {
      local_204 = 0xffffffff;
      LOCK();
      local_208 = *local_850;
      *local_850 = *local_850 + -1;
      UNLOCK();
      if (local_208 == 1) {
        if (local_838 == (long *)0x0) {
          local_60 = local_858;
          if (local_858 != (undefined4 *)0x0) {
            free(local_858);
          }
        }
        else {
          (**(code **)(*local_838 + 0x18))(local_838,local_858);
        }
      }
    }
    local_858 = (undefined4 *)0x0;
    local_848 = 0;
    local_840 = 0;
    local_830 = 0;
    local_82c = 0;
    local_828 = 0;
    local_824 = 0;
    local_820 = 0;
    local_818 = 0;
    local_850 = (int *)0x0;
joined_r0x00d04b0d:
    if (local_760 != 0) goto LAB_00d04c48;
  }
  else if (*(int *)(in_RDI + 0xd0) == 1) {
    local_968 = local_6ec;
    local_96c = local_6f0;
    local_4c8 = &local_9b8;
    local_4d0 = &local_750;
    local_9b8 = local_750;
    local_9b0 = local_748;
    local_9a8 = local_740;
    local_9a0 = local_738;
    local_998 = local_730;
    local_990 = local_728;
    local_98c = local_724;
    local_988 = local_720;
    local_984 = local_71c;
    local_980 = local_718;
    local_978 = local_710;
    if (local_748 != (int *)0x0) {
      local_c = 1;
      LOCK();
      local_10 = *local_748;
      *local_748 = *local_748 + 1;
      UNLOCK();
    }
    local_9bc = *(int *)(in_RDI + 0xd4) / 2;
    local_8 = local_4c8;
    if (local_9bc < 1) {
LAB_00d03dec:
      local_a0c = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd4);
      local_a10 = *(float *)(in_RDI + 0xd8) / (float)local_a0c;
      std::allocator<int>::allocator((allocator<int> *)0xd03e47);
      std::vector<int,_std::allocator<int>_>::vector
                (in_stack_fffffffffffff330,in_stack_fffffffffffff328,in_stack_fffffffffffff320);
      std::allocator<int>::~allocator((allocator<int> *)0xd03e73);
      local_a38 = std::vector<int,_std::allocator<int>_>::operator[](&local_a28,0);
      local_a3c = 0;
      local_a40 = 0;
      local_a44 = local_6ec - *(int *)(in_RDI + 0xd4);
      for (local_a48 = 0; local_a48 < *(int *)(in_RDI + 0xd4); local_a48 = local_a48 + 1) {
        for (local_a4c = 0; local_a4c < *(int *)(in_RDI + 0xd4); local_a4c = local_a4c + 1) {
          local_a38[local_a3c] = local_a40;
          local_a3c = local_a3c + 1;
          local_a40 = local_a40 + 1;
        }
        local_a40 = local_a44 + local_a40;
      }
      for (local_a50 = 0; local_a50 < local_6f4; local_a50 = local_a50 + 1) {
        local_678 = &local_aa0;
        local_34c = *(int *)((long)local_6e0 + 0x2c);
        local_350 = (int)local_6e0[6];
        local_354 = *(undefined4 *)((long)local_6e0 + 0x34);
        local_a58 = *local_6e0 + local_6e0[8] * (long)local_a50 * local_6e0[2];
        local_368 = local_6e0[2];
        local_36c = (undefined4)local_6e0[3];
        local_378 = local_6e0[4];
        local_348 = &local_aa0;
        local_2f0 = (long)local_34c * (long)local_350 * local_368;
        local_510 = &local_aa0;
        local_550 = &local_aa0;
        local_2f4 = 0x10;
        local_684 = local_a50;
        local_685 = 1;
        local_aa0 = 0;
        local_a90 = 0;
        local_a88 = 0;
        local_a78 = 0;
        local_a74 = 0;
        local_a70 = 0;
        local_a6c = 0;
        local_a68 = 0;
        local_a60 = 0;
        local_a98 = 0;
        local_690 = &local_ae8;
        local_698 = &local_9b8;
        local_69c = local_a50;
        local_31c = local_984;
        local_328 = (void *)((long)local_9b8 + local_978 * local_a50 * local_9a8);
        local_330 = local_9a8;
        local_334 = local_9a0;
        local_340 = local_998;
        local_310 = &local_ae8;
        local_ae0 = (int *)0x0;
        local_ad8 = local_9a8;
        local_ad0 = local_9a0;
        local_ac8 = local_998;
        local_abc = local_98c;
        local_ab8 = local_988;
        local_ab4 = 1;
        local_ab0 = local_984;
        local_300 = (long)local_98c * (long)local_988 * local_9a8;
        local_304 = 0x10;
        local_aa8 = (local_300 + 0xfU & 0xfffffffffffffff0) / local_9a8;
        local_ac0 = local_990 + -1;
        if (local_990 == 4) {
          local_aa8 = (long)local_98c * (long)local_988;
        }
        local_69d = 1;
        local_360 = local_a58;
        local_220 = local_550;
        local_ae8 = local_328;
        local_a80 = local_378;
        for (local_aec = 0; local_aec < local_96c; local_aec = local_aec + 1) {
          for (local_af0 = 0; local_af0 < local_968; local_af0 = local_af0 + 1) {
            local_4b8 = &local_ae8;
            local_4bc = local_aec;
            local_afc = 0.0;
            for (local_b00 = 0; local_b00 < local_a0c; local_b00 = local_b00 + 1) {
              local_afc = *(float *)((long)local_ae8 +
                                    (long)local_a38[local_b00] * 4 +
                                    (long)local_af0 * 4 +
                                    (long)local_abc * (long)local_aec * local_ad8) + local_afc;
            }
            fVar3 = *(float *)(local_a58 + (long)local_af0 * 4);
            fVar1 = powf(*(float *)(in_RDI + 0xe0) + local_a10 * local_afc,
                         -*(float *)(in_RDI + 0xdc));
            *(float *)(local_a58 + (long)local_af0 * 4) = fVar3 * fVar1;
          }
          local_a58 = local_a58 + (long)local_968 * 4;
        }
        ppvVar2 = &local_ae8;
        local_540 = ppvVar2;
        local_240 = ppvVar2;
        if (local_ae0 != (int *)0x0) {
          local_244 = 0xffffffff;
          LOCK();
          local_248 = *local_ae0;
          *local_ae0 = *local_ae0 + -1;
          UNLOCK();
          if (local_248 == 1) {
            if (local_ac8 == (long *)0x0) {
              local_40 = local_ae8;
              if (local_ae8 != (void *)0x0) {
                free(local_ae8);
              }
            }
            else {
              (**(code **)(*local_ac8 + 0x18))(local_ac8,local_ae8);
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        ppvVar2[2] = (void *)0x0;
        *(undefined4 *)(ppvVar2 + 3) = 0;
        *(undefined4 *)(ppvVar2 + 5) = 0;
        *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
        *(undefined4 *)(ppvVar2 + 6) = 0;
        *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
        *(undefined4 *)(ppvVar2 + 7) = 0;
        ppvVar2[8] = (void *)0x0;
        ppvVar2[1] = (void *)0x0;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff320);
      local_760 = 0;
    }
    else {
      local_a08 = *local_6e8;
      local_9f8 = *(undefined4 *)(local_6e8 + 2);
      uStack_9f4 = *(undefined4 *)((long)local_6e8 + 0x14);
      uStack_9f0 = *(undefined4 *)(local_6e8 + 3);
      uStack_9ec = *(undefined4 *)((long)local_6e8 + 0x1c);
      uStack_9e0 = local_6e8[5];
      local_9d8 = local_6e8[6];
      uStack_9d0 = local_6e8[7];
      uStack_a00 = local_6e8[2];
      local_9e8 = local_6e8[4] & 0xffffffffffffff;
      copy_make_border(in_stack_fffffffffffff360,in_stack_fffffffffffff358,
                       (int)((ulong)in_stack_fffffffffffff350 >> 0x20),
                       (int)in_stack_fffffffffffff350,
                       (int)((ulong)in_stack_fffffffffffff348 >> 0x20),
                       (int)in_stack_fffffffffffff348,in_stack_fffffffffffff370,
                       in_stack_fffffffffffff344,in_stack_fffffffffffff378);
      local_6b8 = &local_9b8;
      if (local_9b8 != (void *)0x0) {
        local_498 = local_6b8;
      }
      if (local_9b8 != (void *)0x0 && local_978 * local_980 != 0) {
        local_6ec = local_98c;
        local_6f0 = local_988;
        goto LAB_00d03dec;
      }
      local_6cc = -100;
      local_760 = 1;
    }
    ppvVar2 = &local_9b8;
    local_530 = ppvVar2;
    local_260 = ppvVar2;
    if (local_9b0 != (int *)0x0) {
      local_264 = 0xffffffff;
      LOCK();
      local_268 = *local_9b0;
      *local_9b0 = *local_9b0 + -1;
      UNLOCK();
      if (local_268 == 1) {
        if (local_998 == (long *)0x0) {
          local_30 = local_9b8;
          if (local_9b8 != (void *)0x0) {
            free(local_9b8);
          }
        }
        else {
          (**(code **)(*local_998 + 0x18))(local_998,local_9b8);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    ppvVar2[2] = (void *)0x0;
    *(undefined4 *)(ppvVar2 + 3) = 0;
    *(undefined4 *)(ppvVar2 + 5) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
    *(undefined4 *)(ppvVar2 + 6) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
    *(undefined4 *)(ppvVar2 + 7) = 0;
    ppvVar2[8] = (void *)0x0;
    ppvVar2[1] = (void *)0x0;
    goto joined_r0x00d04b0d;
  }
  local_6cc = 0;
  local_760 = 1;
LAB_00d04c48:
  ppvVar2 = &local_750;
  if (local_748 != (int *)0x0) {
    local_284 = 0xffffffff;
    LOCK();
    local_288 = *local_748;
    *local_748 = *local_748 + -1;
    UNLOCK();
    if (local_288 == 1) {
      local_520 = ppvVar2;
      local_280 = ppvVar2;
      if (local_730 == (long *)0x0) {
        local_20 = local_750;
        if (local_750 != (void *)0x0) {
          free(local_750);
        }
      }
      else {
        (**(code **)(*local_730 + 0x18))(local_730,local_750);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return local_6cc;
}

Assistant:

int LRN::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            outptr[i] = ptr[i] * ptr[i];
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            float* ssptr = square_sum.channel(q);
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                for (int i = 0; i < size; i++)
                {
                    ssptr[i] += sptr[i];
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                ptr[i] = ptr[i] * powf(bias + alpha_div_size * ssptr[i], -beta);
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            opt_b.use_packing_layout = false;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}